

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

void htmlCharDataSAXCallback(htmlParserCtxtPtr ctxt,xmlChar *buf,int size,int mode)

{
  xmlChar xVar1;
  int iVar2;
  charactersSAXFunc p_Var3;
  cdataBlockSAXFunc UNRECOVERED_JUMPTABLE;
  ulong uVar4;
  
  if (ctxt->sax == (_xmlSAXHandler *)0x0) {
    return;
  }
  if (ctxt->disableSAX != 0) {
    return;
  }
  if (((uint)mode < 2) ||
     (UNRECOVERED_JUMPTABLE = ctxt->sax->cdataBlock, UNRECOVERED_JUMPTABLE == (cdataBlockSAXFunc)0x0
     )) {
    if ((ctxt->name == (xmlChar *)0x0) ||
       ((iVar2 = xmlStrEqual(ctxt->name,"html"), iVar2 != 0 ||
        (iVar2 = xmlStrEqual(ctxt->name,"head"), iVar2 != 0)))) {
      if (size < 1) {
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        do {
          xVar1 = buf[uVar4];
          if ((xVar1 != ' ') && ((xVar1 == '\v' || ((byte)(xVar1 - 0xe) < 0xfb))))
          goto LAB_0016caa9;
          uVar4 = uVar4 + 1;
        } while ((uint)size != uVar4);
        uVar4 = (ulong)(uint)size;
      }
LAB_0016caa9:
      iVar2 = (int)uVar4;
      if (iVar2 != 0) {
        if (ctxt->keepBlanks == 0) {
          p_Var3 = ctxt->sax->ignorableWhitespace;
        }
        else {
          p_Var3 = ctxt->sax->characters;
        }
        if (p_Var3 != (charactersSAXFunc)0x0) {
          (*p_Var3)(ctxt->userData,buf,iVar2);
        }
        buf = buf + (uVar4 & 0xffffffff);
        size = size - iVar2;
      }
      if (size < 1) {
        return;
      }
      htmlStartCharData(ctxt);
      if (1 < ctxt->disableSAX) {
        return;
      }
    }
    if (((mode == 0) && (ctxt->keepBlanks == 0)) && (iVar2 = areBlanks(ctxt,buf,size), 0 < iVar2)) {
      UNRECOVERED_JUMPTABLE = ctxt->sax->ignorableWhitespace;
    }
    else {
      UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
    }
    if (UNRECOVERED_JUMPTABLE == (cdataBlockSAXFunc)0x0) {
      return;
    }
  }
  (*UNRECOVERED_JUMPTABLE)(ctxt->userData,buf,size);
  return;
}

Assistant:

static void
htmlCharDataSAXCallback(htmlParserCtxtPtr ctxt, const xmlChar *buf,
                        int size, int mode) {
    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    if ((mode == 0) || (mode == DATA_RCDATA) ||
        (ctxt->sax->cdataBlock == NULL)) {
        if ((ctxt->name == NULL) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "html")) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "head"))) {
            int i;

            /*
             * Add leading whitespace to html or head elements before
             * calling htmlStartCharData.
             */
            for (i = 0; i < size; i++)
                if (!IS_WS_HTML(buf[i]))
                    break;

            if (i > 0) {
                if (!ctxt->keepBlanks) {
                    if (ctxt->sax->ignorableWhitespace != NULL)
                        ctxt->sax->ignorableWhitespace(ctxt->userData, buf, i);
                } else {
                    if (ctxt->sax->characters != NULL)
                        ctxt->sax->characters(ctxt->userData, buf, i);
                }

                buf += i;
                size -= i;
            }

            if (size <= 0)
                return;

            htmlStartCharData(ctxt);

            if (PARSER_STOPPED(ctxt))
                return;
        }

        if ((mode == 0) &&
            (!ctxt->keepBlanks) &&
            (areBlanks(ctxt, buf, size) > 0)) {
            if (ctxt->sax->ignorableWhitespace != NULL)
                ctxt->sax->ignorableWhitespace(ctxt->userData, buf, size);
        } else {
            if (ctxt->sax->characters != NULL)
                ctxt->sax->characters(ctxt->userData, buf, size);
        }
    } else {
        /*
         * Insert as CDATA, which is the same as HTML_PRESERVE_NODE
         */
        ctxt->sax->cdataBlock(ctxt->userData, buf, size);
    }
}